

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

Message * __thiscall Message::diggest_abi_cxx11_(Message *this)

{
  ostream *this_00;
  void *this_01;
  long in_RSI;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [384];
  Message *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = std::operator<<(local_190,(string *)(in_RSI + 8));
  this_01 = (void *)std::ostream::operator<<(this_00,*(long *)(in_RSI + 0x28));
  std::ostream::operator<<(this_01,*(int *)(in_RSI + 0x30));
  std::__cxx11::stringstream::str();
  sha256((string *)this);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string Message::diggest() {
    std::stringstream ss;
    ss << o << t << c;
    return sha256(ss.str());
}